

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SyntaxClone.cpp
# Opt level: O3

int slang::syntax::deep::clone(__fn *__fn,void *__child_stack,int __flags,void *__arg,...)

{
  SyntaxList<slang::syntax::AttributeInstanceSyntax> *args_1;
  SyntaxNode *args_2;
  StatementSyntax *args_3;
  TimingControlStatementSyntax *pTVar1;
  DeepCloneVisitor visitor;
  DeepCloneVisitor visitor_1;
  DeepCloneVisitor visitor_2;
  DeepCloneVisitor local_33;
  DeepCloneVisitor local_32;
  DeepCloneVisitor local_31;
  NamedLabelSyntax *local_30;
  
  if (*(SyntaxNode **)(__fn + 0x18) == (SyntaxNode *)0x0) {
    local_30 = (NamedLabelSyntax *)0x0;
  }
  else {
    local_30 = (NamedLabelSyntax *)
               detail::
               visitSyntaxNode<slang::syntax::SyntaxNode_const,slang::syntax::DeepCloneVisitor,slang::BumpAllocator&>
                         (*(SyntaxNode **)(__fn + 0x18),&local_33,(BumpAllocator *)__child_stack);
  }
  args_1 = deepClone<slang::syntax::AttributeInstanceSyntax>
                     ((SyntaxList<slang::syntax::AttributeInstanceSyntax> *)(__fn + 0x20),
                      (BumpAllocator *)__child_stack);
  args_2 = detail::
           visitSyntaxNode<slang::syntax::SyntaxNode_const,slang::syntax::DeepCloneVisitor,slang::BumpAllocator&>
                     (*(SyntaxNode **)(__fn + 0x58),&local_32,(BumpAllocator *)__child_stack);
  args_3 = (StatementSyntax *)
           detail::
           visitSyntaxNode<slang::syntax::SyntaxNode_const,slang::syntax::DeepCloneVisitor,slang::BumpAllocator&>
                     (*(SyntaxNode **)(__fn + 0x60),&local_31,(BumpAllocator *)__child_stack);
  pTVar1 = BumpAllocator::
           emplace<slang::syntax::TimingControlStatementSyntax,slang::syntax::NamedLabelSyntax*,slang::syntax::SyntaxList<slang::syntax::AttributeInstanceSyntax>&,slang::syntax::TimingControlSyntax&,slang::syntax::StatementSyntax&>
                     ((BumpAllocator *)__child_stack,&local_30,args_1,(TimingControlSyntax *)args_2,
                      args_3);
  return (int)pTVar1;
}

Assistant:

static SyntaxNode* clone(const TimingControlStatementSyntax& node, BumpAllocator& alloc) {
    return alloc.emplace<TimingControlStatementSyntax>(
        node.label ? deepClone(*node.label, alloc) : nullptr,
        *deepClone(node.attributes, alloc),
        *deepClone<TimingControlSyntax>(*node.timingControl, alloc),
        *deepClone<StatementSyntax>(*node.statement, alloc)
    );
}